

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_ADJ_ITEM pRVar4;
  ulong uVar5;
  REF_INT RVar6;
  ulong uVar7;
  
  pRVar2 = ref_grid->node;
  *allowed = 0;
  pRVar3 = ref_grid->cell[8];
  uVar5 = 0xffffffff;
  if (-1 < node1) {
    uVar5 = 0xffffffff;
    if (node1 < pRVar3->ref_adj->nnode) {
      uVar5 = (ulong)(uint)pRVar3->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar5 != -1) {
    RVar6 = pRVar3->ref_adj->item[(int)uVar5].ref;
    do {
      if (0 < pRVar3->node_per) {
        uVar7 = 0;
        do {
          if (pRVar2->ref_mpi->id !=
              pRVar2->part[pRVar3->c2n[(long)RVar6 * (long)pRVar3->size_per + uVar7]]) {
            return 0;
          }
          uVar7 = uVar7 + 1;
        } while ((uint)pRVar3->node_per != uVar7);
      }
      pRVar4 = pRVar3->ref_adj->item;
      iVar1 = pRVar4[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        RVar6 = -1;
      }
      else {
        RVar6 = pRVar4[uVar5].ref;
      }
    } while (iVar1 != -1);
  }
  uVar5 = 0xffffffff;
  if (-1 < node0) {
    uVar5 = 0xffffffff;
    if (node0 < pRVar3->ref_adj->nnode) {
      uVar5 = (ulong)(uint)pRVar3->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar5 != -1) {
    RVar6 = pRVar3->ref_adj->item[(int)uVar5].ref;
    do {
      if (0 < pRVar3->node_per) {
        uVar7 = 0;
        do {
          if (pRVar2->ref_mpi->id !=
              pRVar2->part[pRVar3->c2n[(long)RVar6 * (long)pRVar3->size_per + uVar7]]) {
            return 0;
          }
          uVar7 = uVar7 + 1;
        } while ((uint)pRVar3->node_per != uVar7);
      }
      pRVar4 = pRVar3->ref_adj->item;
      iVar1 = pRVar4[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        RVar6 = -1;
      }
      else {
        RVar6 = pRVar4[uVar5].ref;
      }
    } while (iVar1 != -1);
  }
  pRVar3 = ref_grid->cell[3];
  uVar5 = 0xffffffff;
  if (-1 < node1) {
    uVar5 = 0xffffffff;
    if (node1 < pRVar3->ref_adj->nnode) {
      uVar5 = (ulong)(uint)pRVar3->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar5 != -1) {
    RVar6 = pRVar3->ref_adj->item[(int)uVar5].ref;
    do {
      if (0 < pRVar3->node_per) {
        uVar7 = 0;
        do {
          if (pRVar2->ref_mpi->id !=
              pRVar2->part[pRVar3->c2n[(long)RVar6 * (long)pRVar3->size_per + uVar7]]) {
            return 0;
          }
          uVar7 = uVar7 + 1;
        } while ((uint)pRVar3->node_per != uVar7);
      }
      pRVar4 = pRVar3->ref_adj->item;
      iVar1 = pRVar4[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        RVar6 = -1;
      }
      else {
        RVar6 = pRVar4[uVar5].ref;
      }
    } while (iVar1 != -1);
  }
  uVar5 = 0xffffffff;
  if (-1 < node0) {
    uVar5 = 0xffffffff;
    if (node0 < pRVar3->ref_adj->nnode) {
      uVar5 = (ulong)(uint)pRVar3->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar5 != -1) {
    RVar6 = pRVar3->ref_adj->item[(int)uVar5].ref;
    do {
      if (0 < pRVar3->node_per) {
        uVar7 = 0;
        do {
          if (pRVar2->ref_mpi->id !=
              pRVar2->part[pRVar3->c2n[(long)RVar6 * (long)pRVar3->size_per + uVar7]]) {
            return 0;
          }
          uVar7 = uVar7 + 1;
        } while ((uint)pRVar3->node_per != uVar7);
      }
      pRVar4 = pRVar3->ref_adj->item;
      iVar1 = pRVar4[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        RVar6 = -1;
      }
      else {
        RVar6 = pRVar4[uVar5].ref;
      }
    } while (iVar1 != -1);
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_local_cell(REF_GRID ref_grid,
                                                REF_INT node0, REF_INT node1,
                                                REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  /* may be able to relax node0 local if geom constraint is o.k. */

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  /* for parallel surf and twod */
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}